

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase325::run(TestCase325 *this)

{
  Scope *pSVar1;
  Builder builder;
  OwnPromiseNode node;
  CapTableBuilder *pCVar2;
  undefined8 uVar3;
  WirePointer *pWVar4;
  Schema SVar5;
  undefined8 uVar6;
  long *plVar7;
  long lVar8;
  byte abVar9 [8];
  RequestHook *pRVar10;
  void *pvVar11;
  Reader *value;
  size_t sVar12;
  void *__buf;
  void *__buf_00;
  int iVar13;
  Maybe<capnp::MessageSize> *pMVar14;
  TransformPromiseNodeBase *this_00;
  Own<capnp::ClientHook,_std::nullptr_t> OVar15;
  StringPtr methodName;
  StringPtr methodName_00;
  StringPtr methodName_01;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  bool barFailed;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:345:7),_capnp::Response<capnp::DynamicStruct>_>
  promise3;
  int callCount;
  Client client;
  Response<capnp::DynamicStruct> response1;
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> request3;
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> request2;
  WaitScope waitScope;
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_1;
  Response<capnp::DynamicStruct> response2;
  RemotePromise<capnp::DynamicStruct> promise2;
  RemotePromise<capnp::DynamicStruct> promise1;
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> request1;
  EventLoop loop;
  undefined1 local_3d1;
  OwnPromiseNode local_3d0;
  undefined1 local_3c4 [8];
  byte abStack_3bc [4];
  CapTableBuilder *pCStack_3b8;
  undefined1 *local_3b0;
  undefined1 local_3a8 [32];
  WirePointer *local_388;
  undefined8 uStack_380;
  Disposer *local_378;
  RequestHook *local_370;
  Schema local_368;
  undefined1 local_360 [72];
  undefined1 local_318 [72];
  EventLoop *local_2d0;
  byte local_2c8 [8];
  long local_2c0;
  byte abStack_2b8 [8];
  ArrayPtr<const_char> local_2b0;
  char *local_2a0;
  undefined1 local_298 [40];
  bool local_270;
  Reader local_268;
  undefined1 local_220 [72];
  undefined8 *local_1d8;
  long *local_1d0;
  long local_1c8;
  byte abStack_1c0 [8];
  undefined8 *local_1b8;
  char *local_1b0;
  undefined *puStack_1a8;
  byte local_1a0 [8];
  char *local_198;
  undefined *puStack_190;
  byte local_188 [8];
  char *local_180;
  undefined *puStack_178;
  byte local_170 [8];
  undefined1 local_168 [12];
  byte abStack_15c [4];
  CapTableBuilder *pCStack_158;
  Disposer *local_138;
  RequestHook *local_130;
  WirePointer *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  bool in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff11 [23];
  bool bVar16;
  undefined7 in_stack_ffffffffffffff29;
  Maybe<capnp::MessageSize> local_c0;
  EventLoop local_a8;
  void *__buf_01;
  
  kj::EventLoop::EventLoop(&local_a8);
  local_2c8[0] = 0xff;
  local_2c8[1] = 0xff;
  local_2c8[2] = 0xff;
  local_2c8[3] = 0xff;
  local_2c0 = 0;
  abStack_2b8[0] = '\0';
  abStack_2b8[1] = '\0';
  abStack_2b8[2] = '\0';
  abStack_2b8[3] = '\0';
  abStack_2b8[4] = '\0';
  abStack_2b8[5] = '\0';
  abStack_2b8[6] = '\0';
  abStack_2b8[7] = '\0';
  local_2d0 = &local_a8;
  kj::EventLoop::enterScope(&local_a8);
  local_3c4._0_4_ = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)local_360,(int *)local_3c4);
  local_318._0_8_ = local_360._0_8_;
  local_318._8_8_ = &(((SegmentReader *)local_360._8_8_)->ptr).size_;
  if ((SegmentBuilder *)local_360._8_8_ == (SegmentBuilder *)0x0) {
    local_318._8_8_ = (Server *)0x0;
  }
  local_360._8_8_ = (SegmentBuilder *)0x0;
  OVar15 = Capability::Client::makeLocalClient
                     ((Client *)(local_168 + 8),
                      (Own<capnp::Capability::Server,_std::nullptr_t> *)local_318);
  uVar3 = local_318._8_8_;
  if ((Server *)local_318._8_8_ != (Server *)0x0) {
    local_318._8_8_ = (Server *)0x0;
    (*(_func_int *)(*(RawSchema **)local_318._0_8_)->id)
              (local_318._0_8_,(char *)(uVar3 + (long)(*(Arena **)uVar3)[-2]._vptr_Arena),OVar15.ptr
              );
  }
  uVar3 = local_360._8_8_;
  local_168._0_8_ = &Capability::Client::typeinfo;
  local_3c4._4_4_ = local_168._8_4_;
  abStack_3bc[0] = abStack_15c[0];
  abStack_3bc[1] = abStack_15c[1];
  abStack_3bc[2] = abStack_15c[2];
  abStack_3bc[3] = abStack_15c[3];
  pCStack_3b8 = pCStack_158;
  pCStack_158 = (CapTableBuilder *)0x0;
  local_3b0 = schemas::s_88eb12a0e0af92b2 + 0x48;
  if ((SegmentBuilder *)local_360._8_8_ != (SegmentBuilder *)0x0) {
    local_360._8_8_ = (SegmentBuilder *)0x0;
    (*(_func_int *)(*(RawSchema **)local_360._0_8_)->id)
              (local_360._0_8_,
               (uchar *)(uVar3 + (long)((SegmentReader *)uVar3)->arena[-2]._vptr_Arena));
  }
  pMVar14 = &local_c0;
  local_c0.ptr.isSet = false;
  methodName.content.size_ = 4;
  methodName.content.ptr = "foo";
  DynamicCapability::Client::newRequest
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_168,
             (Client *)(local_3c4 + 4),methodName,pMVar14);
  iVar13 = (int)pMVar14;
  local_318._0_4_ = INT;
  local_318._8_8_ = (Server *)0x7b;
  name_01.content.size_ = 2;
  name_01.content.ptr = "i";
  DynamicStruct::Builder::set((Builder *)local_168,name_01,(Reader *)local_318);
  DynamicValue::Reader::~Reader((Reader *)local_318);
  value = (Reader *)local_318;
  local_318._0_4_ = 2;
  local_318[8] = 1;
  name_02.content.size_ = 2;
  name_02.content.ptr = "j";
  DynamicStruct::Builder::set((Builder *)local_168,name_02,value);
  DynamicValue::Reader::~Reader((Reader *)local_318);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)(local_220 + 0x38),
             (int)local_168,__buf,(size_t)value,iVar13);
  pMVar14 = (Maybe<capnp::MessageSize> *)&stack0xffffffffffffff28;
  bVar16 = false;
  methodName_00.content.size_ = 4;
  methodName_00.content.ptr = "baz";
  DynamicCapability::Client::newRequest
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_318,
             (Client *)(local_3c4 + 4),methodName_00,pMVar14);
  iVar13 = (int)pMVar14;
  sVar12 = 2;
  DynamicStruct::Builder::init((Builder *)local_360,(EVP_PKEY_CTX *)local_318);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&stack0xfffffffffffffee0,(Builder *)local_360);
  builder.builder.segment = (SegmentBuilder *)in_stack_ffffffffffffff08;
  builder.schema.super_Schema.raw = (Schema)(Schema)in_stack_ffffffffffffff00;
  builder.builder.capTable._0_1_ = in_stack_ffffffffffffff10;
  builder.builder._9_23_ = in_stack_ffffffffffffff11;
  builder.builder.dataSize._0_1_ = bVar16;
  builder.builder._33_7_ = in_stack_ffffffffffffff29;
  initDynamicTestMessage(builder);
  DynamicValue::Builder::~Builder((Builder *)local_360);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_220,(int)local_318,
             __buf_00,sVar12,iVar13);
  local_3d1 = '\0';
  pMVar14 = (Maybe<capnp::MessageSize> *)&stack0xffffffffffffff10;
  methodName_01.content.size_ = 4;
  methodName_01.content.ptr = "bar";
  sVar12 = 4;
  DynamicCapability::Client::newRequest
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_360,
             (Client *)(local_3c4 + 4),methodName_01,pMVar14);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_3a8,(int)local_360,
             __buf_01,sVar12,(int)pMVar14);
  uVar3 = local_3a8._0_8_;
  pSVar1 = (Scope *)((PromiseArenaMember *)local_3a8._0_8_)->arena;
  if (pSVar1 == (Scope *)0x0 || (ulong)(local_3a8._0_8_ - (long)pSVar1) < 0x30) {
    pvVar11 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)local_3a8,
               kj::_::
               TransformPromiseNode<capnp::Response<capnp::DynamicStruct>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:345:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:347:10)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3d0) = &PTR_destroy_006dfd98;
    *(undefined1 **)((long)pvVar11 + 0x3f8) = &local_3d1;
    *(void **)((long)pvVar11 + 0x3d8) = pvVar11;
  }
  else {
    ((PromiseArenaMember *)local_3a8._0_8_)->arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_3a8._0_8_ + -0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)local_3a8,
               kj::_::
               TransformPromiseNode<capnp::Response<capnp::DynamicStruct>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:345:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:347:10)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar3 + -0x30))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_006dfd98;
    ((PromiseArenaMember *)(uVar3 + -0x10))->arena = (PromiseArena *)&local_3d1;
    ((PromiseArenaMember *)(uVar3 + -0x30))->arena = (PromiseArena *)pSVar1;
  }
  uVar3 = uStack_380;
  pWVar4 = local_388;
  local_3d0.ptr = &this_00->super_PromiseNode;
  if (local_388 != (WirePointer *)0x0) {
    local_388 = (WirePointer *)0x0;
    uStack_380._0_4_ = 0;
    uStack_380._4_2_ = 0;
    uStack_380._6_2_ = 0;
    (**local_378->_vptr_Disposer)(local_378,pWVar4,8,uVar3,uVar3,0);
  }
  uVar3 = local_3a8._24_8_;
  if ((long *)local_3a8._24_8_ != (long *)0x0) {
    local_3a8._24_8_ = (long *)0x0;
    (**((CapTableReader *)local_3a8._16_8_)->_vptr_CapTableReader)
              (local_3a8._16_8_,uVar3 + *(long *)(*(long *)uVar3 + -0x10));
  }
  uVar3 = local_3a8._0_8_;
  if ((RawBrandedSchema *)local_3a8._0_8_ != (RawBrandedSchema *)0x0) {
    local_3a8._0_8_ = (RawBrandedSchema *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  local_3a8._0_8_ = local_3a8._0_8_ & 0xffffffff00000000;
  local_3a8._16_8_ = " == ";
  local_3a8._24_8_ = &DAT_00000005;
  local_388 = (WirePointer *)CONCAT71(local_388._1_7_,local_3c4._0_4_ == 0);
  local_3a8._8_8_ = (SegmentBuilder *)local_3c4;
  if ((local_3c4._0_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_268.type = UNKNOWN;
    kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x160,ERROR,
               "\"failed: expected \" \"(0) == (callCount)\", _kjCondition, 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",
               (DebugComparison<int,_int_&> *)local_3a8,(int *)&local_268,(int *)local_3c4);
  }
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_178 = &DAT_004fd5db;
  local_170[0] = 'b';
  local_170[1] = '\x01';
  local_170[2] = '\0';
  local_170[3] = '\0';
  local_170[4] = '\x14';
  local_170[5] = '\0';
  local_170[6] = '\0';
  local_170[7] = '\0';
  kj::Promise<capnp::Response<capnp::DynamicStruct>_>::wait
            ((Promise<capnp::Response<capnp::DynamicStruct>_> *)local_3a8,local_220 + 0x38);
  local_2a0 = "foo";
  name.content.size_ = 2;
  name.content.ptr = "x";
  DynamicStruct::Reader::get(&local_268,(Reader *)local_3a8,name);
  local_2b0 = (ArrayPtr<const_char>)
              DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(&local_268);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_298,
             (DebugExpression<char_const(&)[4]> *)&local_2a0,(Reader *)&local_2b0);
  DynamicValue::Reader::~Reader(&local_268);
  if ((local_270 == false) && (kj::_::Debug::minSeverity < 3)) {
    name_00.content.size_ = 2;
    name_00.content.ptr = "x";
    DynamicStruct::Reader::get(&local_268,(Reader *)local_3a8,name_00);
    local_2b0 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(&local_268);
    kj::_::Debug::
    log<char_const(&)[60],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x164,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (response1.get(\\\"x\\\").as<Text>())\", _kjCondition, \"foo\", response1.get(\"x\").as<Text>()"
               ,(char (*) [60])"failed: expected (\"foo\") == (response1.get(\"x\").as<Text>())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_298,
               (char (*) [4])"foo",(Reader *)&local_2b0);
    DynamicValue::Reader::~Reader(&local_268);
  }
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_190 = &DAT_004fd5db;
  local_188[0] = 'f';
  local_188[1] = '\x01';
  local_188[2] = '\0';
  local_188[3] = '\0';
  local_188[4] = '\x14';
  local_188[5] = '\0';
  local_188[6] = '\0';
  local_188[7] = '\0';
  kj::Promise<capnp::Response<capnp::DynamicStruct>_>::wait
            ((Promise<capnp::Response<capnp::DynamicStruct>_> *)&local_268,local_220);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_1a8 = &DAT_004fd5db;
  local_1a0[0] = 'h';
  local_1a0[1] = '\x01';
  local_1a0[2] = '\0';
  local_1a0[3] = '\0';
  local_1a0[4] = '\x03';
  local_1a0[5] = '\0';
  local_1a0[6] = '\0';
  local_1a0[7] = '\0';
  kj::Promise<void>::wait((Promise<void> *)&local_3d0,&local_2d0);
  local_298[0x20] = local_3c4._0_4_ == 2;
  local_298._0_4_ = 2;
  local_298._16_8_ = " == ";
  local_298._24_8_ = &DAT_00000005;
  local_298._8_8_ = (SegmentBuilder *)local_3c4;
  if ((!local_298[0x20]) && (kj::_::Debug::minSeverity < 3)) {
    local_2b0.ptr._0_4_ = 2;
    kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x16a,ERROR,
               "\"failed: expected \" \"(2) == (callCount)\", _kjCondition, 2, callCount",
               (char (*) [36])"failed: expected (2) == (callCount)",
               (DebugComparison<int,_int_&> *)local_298,(int *)&local_2b0,(int *)local_3c4);
  }
  local_298._0_8_ = &local_3d1;
  if ((local_3d1 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[27],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x16b,ERROR,"\"failed: expected \" \"barFailed\", _kjCondition",
               (char (*) [27])"failed: expected barFailed",(DebugExpression<bool_&> *)local_298);
  }
  uVar3 = local_268.field_1._56_8_;
  if (local_268.field_1._56_8_ != (long *)0x0) {
    local_268.field_1._56_8_ = (long *)0x0;
    (*(code *)**(undefined8 **)local_268.field_1._48_8_)
              (local_268.field_1._48_8_,uVar3 + *(long *)(*(long *)uVar3 + -0x10));
  }
  SVar5.raw = local_368.raw;
  if (local_368.raw != (RawBrandedSchema *)0x0) {
    local_368.raw = (RawBrandedSchema *)0x0;
    (**local_370->_vptr_RequestHook)
              (local_370,
               (long)&(SVar5.raw)->generic +
               (long)(SVar5.raw)->generic[-1].defaultBrand.lazyInitializer);
  }
  node.ptr = local_3d0.ptr;
  if ((TransformPromiseNodeBase *)local_3d0.ptr != (TransformPromiseNodeBase *)0x0) {
    local_3d0.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  uVar3 = local_360._56_8_;
  if ((long *)local_360._56_8_ != (long *)0x0) {
    local_360._56_8_ = (long *)0x0;
    (*(code *)**(undefined8 **)local_360._48_8_)
              (local_360._48_8_,uVar3 + *(long *)(*(long *)uVar3 + -0x10));
  }
  uVar6 = local_220._40_8_;
  uVar3 = local_220._32_8_;
  if ((WirePointer *)local_220._32_8_ != (WirePointer *)0x0) {
    local_220._32_8_ = (WirePointer *)0x0;
    local_220._40_4_ = 0;
    local_220._44_2_ = 0;
    local_220._46_2_ = 0;
    (***(_func_int ***)local_220._48_8_)(local_220._48_8_,uVar3,8,uVar6,uVar6,0);
  }
  uVar3 = local_220._24_8_;
  if ((long *)local_220._24_8_ != (long *)0x0) {
    local_220._24_8_ = (long *)0x0;
    (**((CapTableReader *)local_220._16_8_)->_vptr_CapTableReader)
              (local_220._16_8_,uVar3 + *(long *)(*(long *)uVar3 + -0x10));
  }
  uVar3 = local_220._0_8_;
  if ((RawBrandedSchema *)local_220._0_8_ != (RawBrandedSchema *)0x0) {
    local_220._0_8_ = (RawBrandedSchema *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  uVar3 = local_318._56_8_;
  if ((long *)local_318._56_8_ != (long *)0x0) {
    local_318._56_8_ = (long *)0x0;
    (*(code *)**(undefined8 **)local_318._48_8_)
              (local_318._48_8_,uVar3 + *(long *)(*(long *)uVar3 + -0x10));
  }
  abVar9 = abStack_1c0;
  lVar8 = local_1c8;
  if (local_1c8 != 0) {
    local_1c8 = 0;
    abStack_1c0[0] = '\0';
    abStack_1c0[1] = '\0';
    abStack_1c0[2] = '\0';
    abStack_1c0[3] = '\0';
    abStack_1c0[4] = '\0';
    abStack_1c0[5] = '\0';
    abStack_1c0[6] = '\0';
    abStack_1c0[7] = '\0';
    (**(code **)*local_1b8)(local_1b8,lVar8,8,abVar9,abVar9,0);
  }
  plVar7 = local_1d0;
  if (local_1d0 != (long *)0x0) {
    local_1d0 = (long *)0x0;
    (**(code **)*local_1d8)(local_1d8,(long)plVar7 + *(long *)(*plVar7 + -0x10));
  }
  uVar3 = local_220._56_8_;
  if ((PromiseArenaMember *)local_220._56_8_ != (PromiseArenaMember *)0x0) {
    local_220._56_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  pRVar10 = local_130;
  if (local_130 != (RequestHook *)0x0) {
    local_130 = (RequestHook *)0x0;
    (**local_138->_vptr_Disposer)
              (local_138,
               (_func_int *)
               ((long)&pRVar10->_vptr_RequestHook + (long)pRVar10->_vptr_RequestHook[-2]));
  }
  pCVar2 = pCStack_3b8;
  if (pCStack_3b8 != (CapTableBuilder *)0x0) {
    pCStack_3b8 = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(abStack_3bc,local_3c4._4_4_))
              ((undefined8 *)CONCAT44(abStack_3bc,local_3c4._4_4_),
               (pCVar2->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&(pCVar2->super_CapTableReader)._vptr_CapTableReader);
  }
  if (local_2c0 == 0) {
    kj::EventLoop::leaveScope(local_2d0);
  }
  kj::EventLoop::~EventLoop(&local_a8);
  return;
}

Assistant:

TEST(Capability, DynamicClient) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  DynamicCapability::Client client =
      test::TestInterface::Client(kj::heap<TestInterfaceImpl>(callCount));

  auto request1 = client.newRequest("foo");
  request1.set("i", 123);
  request1.set("j", true);
  auto promise1 = request1.send();

  auto request2 = client.newRequest("baz");
  initDynamicTestMessage(request2.init("s").as<DynamicStruct>());
  auto promise2 = request2.send();

  bool barFailed = false;
  auto request3 = client.newRequest("bar");
  auto promise3 = request3.send().then(
      [](Response<DynamicStruct>&& response) {
        ADD_FAILURE() << "Expected bar() call to fail.";
      }, [&](kj::Exception&& e) {
        EXPECT_EQ(kj::Exception::Type::UNIMPLEMENTED, e.getType());
        barFailed = true;
      });

  EXPECT_EQ(0, callCount);

  auto response1 = promise1.wait(waitScope);

  EXPECT_EQ("foo", response1.get("x").as<Text>());

  auto response2 = promise2.wait(waitScope);

  promise3.wait(waitScope);

  EXPECT_EQ(2, callCount);
  EXPECT_TRUE(barFailed);
}